

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O0

int __thiscall de::Socket::shutdown(Socket *this,int __fd,int __how)

{
  deBool dVar1;
  SocketError *this_00;
  allocator<char> local_31;
  string local_30;
  Socket *local_10;
  Socket *this_local;
  
  local_10 = this;
  dVar1 = deSocket_shutdown(this->m_socket,3);
  if (dVar1 == 0) {
    this_00 = (SocketError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Socket shutdown failed",&local_31);
    SocketError::SocketError(this_00,&local_30);
    __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
  }
  return dVar1;
}

Assistant:

void Socket::shutdown (void)
{
	if (!deSocket_shutdown(m_socket, DE_SOCKETCHANNEL_BOTH))
		throw SocketError("Socket shutdown failed");
}